

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 MemObjTryIntger(jx9_value *pObj)

{
  double dVar1;
  long lVar2;
  
  dVar1 = (pObj->x).rVal;
  lVar2 = (long)dVar1;
  if (9.223372036854776e+18 < ABS(dVar1)) {
    lVar2 = -0x8000000000000000;
  }
  if (lVar2 + 0x7fffffffffffffffU < 0xfffffffffffffffe && (double)lVar2 == dVar1) {
    (pObj->x).iVal = lVar2;
    pObj->iFlags = 2;
  }
  return (sxi32)lVar2;
}

Assistant:

static sxi32 MemObjTryIntger(jx9_value *pObj)
{
	sxi64 iVal = MemObjRealToInt(&(*pObj));
  /* Only mark the value as an integer if
  **
  **    (1) the round-trip conversion real->int->real is a no-op, and
  **    (2) The integer is neither the largest nor the smallest
  **        possible integer
  **
  ** The second and third terms in the following conditional enforces
  ** the second condition under the assumption that addition overflow causes
  ** values to wrap around.  On x86 hardware, the third term is always
  ** true and could be omitted.  But we leave it in because other
  ** architectures might behave differently.
  */
	if( pObj->x.rVal ==(jx9_real)iVal && iVal>SMALLEST_INT64 && iVal<LARGEST_INT64 ){
		pObj->x.iVal = iVal; 
		pObj->iFlags = MEMOBJ_INT;
	}
	return SXRET_OK;
}